

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O2

void __thiscall Sparse_matrix_to_QMatrix(void *this,QMatrix *qmatrix)

{
  size_t RoC;
  size_t sVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  RoC = 0;
  while (uVar4 = RoC, uVar4 < *this) {
    RoC = uVar4 + 1;
    uVar3 = *(int *)(*(long *)((long)this + 8) + 4 + uVar4 * 4) -
            *(int *)(*(long *)((long)this + 8) + uVar4 * 4);
    Q_SetLen(qmatrix,RoC,(ulong)(uVar3 + 1));
    Q_SetEntry(qmatrix,RoC,0,RoC,*(Real *)(*(long *)((long)this + 0x10) + uVar4 * 8));
    sVar1 = 0;
    while (uVar3 != sVar1) {
      uVar2 = (ulong)(uint)((int)sVar1 + *(int *)(*(long *)((long)this + 8) + uVar4 * 4));
      Q_SetEntry(qmatrix,RoC,sVar1 + 1,(ulong)(*(int *)(*(long *)((long)this + 8) + uVar2 * 4) + 1),
                 *(Real *)(*(long *)((long)this + 0x10) + uVar2 * 8));
      sVar1 = sVar1 + 1;
    }
  }
  return;
}

Assistant:

void Sparse_matrix_to_QMatrix (
    Sparse_matrix const * this,
    QMatrix * qmatrix) {

  register unsigned row, index, row_length, position;

  for (row = 0; row < this->size; ++row) {
    row_length = this->indices[row + 1] - this->indices[row];
    Q_SetLen (qmatrix, row + 1, row_length + 1);
    Q_SetEntry (qmatrix, row + 1, 0, row + 1, this->elements[row]);
    for (index = 0; index < row_length; ++index) {
      position = this->indices[row] + index;
      Q_SetEntry (qmatrix, row + 1, index + 1, this->indices[position] + 1, this->elements[position]);
    }
  }
}